

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_move(Tree *this,Tree *that)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pfn_error p_Var3;
  code *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  bool bVar12;
  long lVar13;
  csubstr cVar14;
  char msg [33];
  char *pcStack_80;
  size_t local_78;
  char *pcStack_58;
  size_t local_50;
  char *pcStack_30;
  size_t local_28;
  
  if (this->m_buf != (NodeData *)0x0) {
    builtin_strncpy(msg + 0x10,"_buf == nullptr)",0x11);
    builtin_strncpy(msg,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var3 = (this->m_callbacks).m_error;
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_28 = cVar14.len;
    pcStack_30 = cVar14.str;
    LVar9.super_LineCol.col = 0;
    LVar9.super_LineCol.offset = SUB168(ZEXT816(0x62fa) << 0x40,0);
    LVar9.super_LineCol.line = SUB168(ZEXT816(0x62fa) << 0x40,8);
    LVar9.name.str = pcStack_30;
    LVar9.name.len = local_28;
    (*p_Var3)(msg,0x21,LVar9,(this->m_callbacks).m_user_data);
  }
  if ((this->m_arena).str != (char *)0x0) {
    builtin_strncpy(msg + 0x10,"_arena.str == nul",0x11);
    builtin_strncpy(msg,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var3 = (this->m_callbacks).m_error;
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_50 = cVar14.len;
    pcStack_58 = cVar14.str;
    LVar10.super_LineCol.col = 0;
    LVar10.super_LineCol.offset = SUB168(ZEXT816(0x62fb) << 0x40,0);
    LVar10.super_LineCol.line = SUB168(ZEXT816(0x62fb) << 0x40,8);
    LVar10.name.str = pcStack_58;
    LVar10.name.len = local_50;
    (*p_Var3)(msg,0x27,LVar10,(this->m_callbacks).m_user_data);
  }
  if ((this->m_arena).len != 0) {
    builtin_strncpy(msg + 0x10,"_arena.len == 0)",0x11);
    builtin_strncpy(msg,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var3 = (this->m_callbacks).m_error;
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_78 = cVar14.len;
    pcStack_80 = cVar14.str;
    LVar11.super_LineCol.col = 0;
    LVar11.super_LineCol.offset = SUB168(ZEXT816(0x62fc) << 0x40,0);
    LVar11.super_LineCol.line = SUB168(ZEXT816(0x62fc) << 0x40,8);
    LVar11.name.str = pcStack_80;
    LVar11.name.len = local_78;
    (*p_Var3)(msg,0x21,LVar11,(this->m_callbacks).m_user_data);
  }
  this->m_buf = that->m_buf;
  sVar5 = that->m_size;
  this->m_cap = that->m_cap;
  this->m_size = sVar5;
  sVar5 = that->m_free_tail;
  this->m_free_head = that->m_free_head;
  this->m_free_tail = sVar5;
  sVar5 = (that->m_arena).len;
  (this->m_arena).str = (that->m_arena).str;
  (this->m_arena).len = sVar5;
  this->m_arena_pos = that->m_arena_pos;
  for (lVar13 = 0x60; lVar13 != 0x100; lVar13 = lVar13 + 0x28) {
    *(undefined8 *)((long)this->m_tag_directives + lVar13 + -0x40) =
         *(undefined8 *)((long)that->m_tag_directives + lVar13 + -0x40);
    puVar1 = (undefined8 *)((long)that->m_tag_directives + lVar13 + -0x60);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    puVar1 = (undefined8 *)((long)(that->m_tag_directives + -2) + lVar13);
    uVar8 = puVar1[1];
    puVar2 = (undefined8 *)((long)(this->m_tag_directives + -2) + lVar13);
    *puVar2 = *puVar1;
    puVar2[1] = uVar8;
    puVar1 = (undefined8 *)((long)this->m_tag_directives + lVar13 + -0x60);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
  }
  _clear(that);
  return;
}

Assistant:

void Tree::_move(Tree & that)
{
    _RYML_CB_ASSERT(m_callbacks, m_buf == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.str == nullptr);
    _RYML_CB_ASSERT(m_callbacks, m_arena.len == 0);
    m_buf = that.m_buf;
    m_cap = that.m_cap;
    m_size = that.m_size;
    m_free_head = that.m_free_head;
    m_free_tail = that.m_free_tail;
    m_arena = that.m_arena;
    m_arena_pos = that.m_arena_pos;
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = that.m_tag_directives[i];
    that._clear();
}